

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::ProgramExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ProgramExpr *this)

{
  Token *pTVar1;
  pointer puVar2;
  long *plVar3;
  long *plVar4;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  pointer puVar5;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_1;
  long *local_98;
  long local_88;
  long lStack_80;
  long *local_78;
  ulong local_70;
  long local_68;
  long lStack_60;
  ProgramExpr *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pTVar1 = this->progName;
  if (pTVar1 != (Token *)0x0) {
    (*pTVar1->_vptr_Token[2])(local_50,pTVar1,(this->super_Expr).lexer);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1215d8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_88 = *plVar4;
      lStack_80 = plVar3[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar4;
      local_98 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  puVar5 = (this->imports).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->imports).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (puVar5 != puVar2) {
    do {
      (*((puVar5->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_78);
      plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_88 = *plVar4;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar4;
        local_98 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  puVar5 = (local_58->defs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_58->defs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar2) {
    do {
      (*((puVar5->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_78);
      plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_88 = *plVar4;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar4;
        local_98 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ProgramExpr::toString() const noexcept {
  std::string result;
  if (progName)
    result += "use mod " + progName->toString(getLexer()) + '\n';

  for (auto &expr : imports)
    result += expr->toString() + '\n';

  for (auto &expr : defs)
    result += expr->toString() + '\n';

  return result;
}